

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O0

int __thiscall deci::ast_identifier_t::Generate(ast_identifier_t *this,ostream *output,int pc)

{
  ostream *poVar1;
  int pc_local;
  ostream *output_local;
  ast_identifier_t *this_local;
  
  poVar1 = std::operator<<(output,"rval ");
  poVar1 = std::operator<<(poVar1,(string *)&this->value);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return pc + 1;
}

Assistant:

int ast_identifier_t::Generate(std::ostream& output, int pc) const {
    output << "rval " << this->value << std::endl; 
    return pc + 1;
  }